

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode multi_socket(Curl_multi *multi,_Bool checkall,curl_socket_t s,int ev_bitmask,
                      int *running_handles)

{
  sigpipe_ignore *ig;
  CURLMcode CVar1;
  Curl_sh_entry *hash;
  Curl_hash_element *pCVar2;
  Curl_llist_node *n;
  Curl_easy *data;
  undefined7 in_register_00000031;
  curltime cVar3;
  multi_run_ctx local_110;
  Curl_hash_iterator iter;
  
  memset(&local_110.now.tv_usec,0,0xb8);
  local_110.multi = multi;
  cVar3 = Curl_now();
  local_110.now.tv_sec = cVar3.tv_sec;
  local_110.now.tv_usec = cVar3.tv_usec;
  ig = &local_110.pipe_st;
  memset(ig,0,0xa0);
  local_110.pipe_st.no_signal = true;
  if ((int)CONCAT71(in_register_00000031,checkall) == 0) {
    if (s != -1) {
      hash = sh_getentry(&multi->sockhash,s);
      if (hash == (Curl_sh_entry *)0x0) {
        Curl_cpool_multi_socket(multi,s,ev_bitmask);
      }
      else {
        Curl_hash_start_iterate(&hash->transfers,&iter);
        pCVar2 = Curl_hash_next_element(&iter);
        while (pCVar2 != (Curl_hash_element *)0x0) {
          if ((Curl_easy *)pCVar2->ptr == (multi->cpool).idata) {
            local_110.run_cpool = true;
          }
          else {
            Curl_expire_ex((Curl_easy *)pCVar2->ptr,&local_110.now,0,EXPIRE_RUN_NOW);
          }
          pCVar2 = Curl_hash_next_element(&iter);
        }
      }
    }
    CVar1 = multi_run_expired(&local_110);
    if ((CVar1 == CURLM_OK) && (local_110.run_xfers != 0)) {
      cVar3 = Curl_now();
      local_110.now.tv_sec = cVar3.tv_sec;
      local_110.now.tv_usec = cVar3.tv_usec;
      CVar1 = multi_run_expired(&local_110);
    }
  }
  else {
    CVar1 = curl_multi_perform(multi,running_handles);
    if (CVar1 == CURLM_BAD_HANDLE) {
      CVar1 = CURLM_BAD_HANDLE;
    }
    else {
      n = Curl_llist_head(&multi->process);
      while ((n != (Curl_llist_node *)0x0 && (CVar1 == CURLM_OK))) {
        data = (Curl_easy *)Curl_node_elem(n);
        CVar1 = singlesocket(multi,data);
        n = Curl_node_next(n);
      }
    }
    local_110.run_cpool = true;
  }
  if (local_110.run_cpool == true) {
    sigpipe_apply((multi->cpool).idata,ig);
    Curl_cpool_multi_perform(multi);
  }
  sigpipe_restore(ig);
  if (running_handles != (int *)0x0) {
    *running_handles = multi->num_alive;
  }
  if (CVar1 < CURLM_BAD_HANDLE) {
    CVar1 = Curl_update_timer(multi);
  }
  return CVar1;
}

Assistant:

static CURLMcode multi_socket(struct Curl_multi *multi,
                              bool checkall,
                              curl_socket_t s,
                              int ev_bitmask,
                              int *running_handles)
{
  CURLMcode result = CURLM_OK;
  struct Curl_easy *data = NULL;
  struct multi_run_ctx mrc;

  (void)ev_bitmask;
  memset(&mrc, 0, sizeof(mrc));
  mrc.multi = multi;
  mrc.now = Curl_now();
  sigpipe_init(&mrc.pipe_st);

  if(checkall) {
    struct Curl_llist_node *e;
    /* *perform() deals with running_handles on its own */
    result = curl_multi_perform(multi, running_handles);

    /* walk through each easy handle and do the socket state change magic
       and callbacks */
    if(result != CURLM_BAD_HANDLE) {
      for(e = Curl_llist_head(&multi->process); e && !result;
          e = Curl_node_next(e)) {
        result = singlesocket(multi, Curl_node_elem(e));
      }
    }
    mrc.run_cpool = TRUE;
    goto out;
  }

  if(s != CURL_SOCKET_TIMEOUT) {
    struct Curl_sh_entry *entry = sh_getentry(&multi->sockhash, s);

    if(!entry) {
      /* Unmatched socket, we cannot act on it but we ignore this fact. In
         real-world tests it has been proved that libevent can in fact give
         the application actions even though the socket was just previously
         asked to get removed, so thus we better survive stray socket actions
         and just move on. */
      /* The socket might come from a connection that is being shut down
       * by the multi's connection pool. */
      Curl_cpool_multi_socket(multi, s, ev_bitmask);
    }
    else {
      struct Curl_hash_iterator iter;
      struct Curl_hash_element *he;

      /* the socket can be shared by many transfers, iterate */
      Curl_hash_start_iterate(&entry->transfers, &iter);
      for(he = Curl_hash_next_element(&iter); he;
          he = Curl_hash_next_element(&iter)) {
        data = (struct Curl_easy *)he->ptr;
        DEBUGASSERT(data);
        DEBUGASSERT(data->magic == CURLEASY_MAGIC_NUMBER);

        if(data == multi->cpool.idata)
          mrc.run_cpool = TRUE;
        else {
          /* Expire with out current now, so we will get it below when
           * asking the splaytree for expired transfers. */
          Curl_expire_ex(data, &mrc.now, 0, EXPIRE_RUN_NOW);
        }
      }
    }
  }

  result = multi_run_expired(&mrc);
  if(result)
    goto out;

  if(mrc.run_xfers) {
    /* Running transfers takes time. With a new timestamp, we might catch
     * other expires which are due now. Instead of telling the application
     * to set a 0 timeout and call us again, we run them here.
     * Do that only once or it might be unfair to transfers on other
     * sockets. */
    mrc.now = Curl_now();
    result = multi_run_expired(&mrc);
  }

out:
  if(mrc.run_cpool) {
    sigpipe_apply(multi->cpool.idata, &mrc.pipe_st);
    Curl_cpool_multi_perform(multi);
  }
  sigpipe_restore(&mrc.pipe_st);

  if(running_handles)
    *running_handles = (int)multi->num_alive;

  if(CURLM_OK >= result)
    result = Curl_update_timer(multi);
  return result;
}